

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyle.cpp
# Opt level: O0

int QStyle::sliderValueFromPosition(int min,int max,int pos,int span,bool upsideDown)

{
  byte bVar1;
  bool bVar2;
  long lVar3;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  int in_EDI;
  byte in_R8B;
  int tmp_1;
  qint64 mod;
  qint64 div;
  int tmp;
  qint64 range;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  undefined8 in_stack_ffffffffffffffb0;
  int local_48;
  int local_44;
  int local_40;
  int local_4;
  
  bVar1 = in_R8B & 1;
  if ((in_ECX < 1) || (in_EDX < 1)) {
    local_40 = in_EDI;
    if (bVar1 != 0) {
      local_40 = in_ESI;
    }
    local_4 = local_40;
  }
  else if (in_EDX < in_ECX) {
    lVar3 = (long)in_ESI - (long)in_EDI;
    bVar2 = q20::cmp_greater<int,long_long>
                      ((int)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                       CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    if (bVar2) {
      local_48 = (int)((lVar3 * 2 * (long)in_EDX + (long)in_ECX) / ((long)in_ECX << 1));
      if (bVar1 == 0) {
        local_48 = local_48 + in_EDI;
      }
      else {
        local_48 = in_ESI - local_48;
      }
      local_4 = local_48;
    }
    else {
      local_4 = in_EDX * (int)(lVar3 / (long)in_ECX) +
                (int)(((lVar3 % (long)in_ECX) * 2 * (long)in_EDX + (long)in_ECX) /
                     ((long)in_ECX << 1));
      if (bVar1 == 0) {
        local_4 = local_4 + in_EDI;
      }
      else {
        local_4 = in_ESI - local_4;
      }
    }
  }
  else {
    local_44 = in_ESI;
    if (bVar1 != 0) {
      local_44 = in_EDI;
    }
    local_4 = local_44;
  }
  return local_4;
}

Assistant:

int QStyle::sliderValueFromPosition(int min, int max, int pos, int span, bool upsideDown)
{
    if (span <= 0 || pos <= 0)
        return upsideDown ? max : min;
    if (pos >= span)
        return upsideDown ? min : max;

    const qint64 range = qint64(max) - min;

    if (q20::cmp_greater(span, range)) {
        const int tmp = (2 * range * pos + span) / (qint64(2) * span);
        return upsideDown ? max - tmp : tmp + min;
    } else {
        const qint64 div = range / span;
        const qint64 mod = range % span;
        const int tmp = pos * div + (2 * mod * pos + span) / (qint64(2) * span);
        return upsideDown ? max - tmp : tmp + min;
    }
    // equiv. to min + (pos*range)/span + 0.5
    // no overflow because of this implicit assumption:
    // pos <= span < sqrt(INT_MAX+0.0625)+0.25 ~ sqrt(INT_MAX)
}